

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O1

void __thiscall
cnn::KMaxPooling::backward_impl
          (KMaxPooling *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Dim *d;
  float fVar1;
  void *pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint k;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ushort uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  int iVar26;
  int iVar27;
  uint local_a4;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  uVar14 = (ulong)(this->super_Node).dim.d[0];
  local_a4 = 1;
  if (1 < (this->super_Node).dim.nd) {
    local_a4 = (this->super_Node).dim.d[1];
  }
  if (uVar14 != 0) {
    d = &(this->super_Node).dim;
    pvVar2 = (this->super_Node).aux_mem;
    uVar15 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      if (local_a4 != 0) {
        uVar12 = 0;
        do {
          uVar10 = (ulong)(this->super_Node).dim.nd;
          if (uVar10 == 0) {
            iVar26 = 1;
          }
          else {
            auVar21 = vpbroadcastq_avx512f();
            uVar11 = 0;
            auVar22 = vpbroadcastd_avx512f(ZEXT416(1));
            do {
              auVar23 = vmovdqa64_avx512f(auVar22);
              auVar22 = vpbroadcastq_avx512f();
              auVar24 = vporq_avx512f(auVar22,auVar19);
              auVar22 = vporq_avx512f(auVar22,auVar20);
              uVar6 = vpcmpuq_avx512f(auVar22,auVar21,2);
              bVar7 = (byte)uVar6;
              uVar6 = vpcmpuq_avx512f(auVar24,auVar21,2);
              bVar8 = (byte)uVar6;
              uVar17 = CONCAT11(bVar8,bVar7);
              auVar22 = vmovdqu32_avx512f(*(undefined1 (*) [64])(d->d + uVar11));
              auVar24._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar22._4_4_;
              auVar24._0_4_ = (uint)(bVar7 & 1) * auVar22._0_4_;
              auVar24._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar22._8_4_;
              auVar24._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar22._12_4_;
              auVar24._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar22._16_4_;
              auVar24._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar22._20_4_;
              auVar24._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar22._24_4_;
              auVar24._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar22._28_4_;
              auVar24._32_4_ = (uint)(bVar8 & 1) * auVar22._32_4_;
              auVar24._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar22._36_4_;
              auVar24._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar22._40_4_;
              auVar24._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar22._44_4_;
              auVar24._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar22._48_4_;
              auVar24._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar22._52_4_;
              auVar24._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar22._56_4_;
              auVar24._60_4_ = (uint)(bVar8 >> 7) * auVar22._60_4_;
              auVar22 = vpmulld_avx512f(auVar24,auVar23);
              uVar11 = uVar11 + 0x10;
            } while ((uVar10 + 0xf & 0x1fffffff0) != uVar11);
            auVar19 = vmovdqa32_avx512f(auVar22);
            auVar20._0_4_ =
                 (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar23._0_4_;
            bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar20._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar23._4_4_;
            bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar20._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar23._8_4_;
            bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar20._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar23._12_4_;
            bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar20._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar23._16_4_;
            bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar20._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar23._20_4_;
            bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar20._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar23._24_4_;
            bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
            auVar20._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar23._28_4_;
            auVar20._32_4_ =
                 (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._32_4_;
            bVar3 = (bool)(bVar8 >> 1 & 1);
            auVar20._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar23._36_4_;
            bVar3 = (bool)(bVar8 >> 2 & 1);
            auVar20._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar23._40_4_;
            bVar3 = (bool)(bVar8 >> 3 & 1);
            auVar20._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar23._44_4_;
            bVar3 = (bool)(bVar8 >> 4 & 1);
            auVar20._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar23._48_4_;
            bVar3 = (bool)(bVar8 >> 5 & 1);
            auVar20._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar23._52_4_;
            bVar3 = (bool)(bVar8 >> 6 & 1);
            auVar20._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar23._56_4_;
            auVar20._60_4_ =
                 (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar23._60_4_;
            auVar18 = vextracti64x4_avx512f(auVar20,1);
            auVar19 = vpmulld_avx512f(auVar20,ZEXT3264(auVar18));
            auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
            auVar5 = vpshufd_avx(auVar4,0xee);
            auVar4 = vpmulld_avx(auVar4,auVar5);
            auVar5 = vpshufd_avx(auVar4,0x55);
            auVar4 = vpmulld_avx(auVar4,auVar5);
            iVar26 = auVar4._0_4_;
          }
          if (iVar26 * (this->super_Node).dim.bd <= (uint)uVar12) {
            __assert_fail("mi < dim.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/conv.cc"
                          ,0x14d,
                          "virtual void cnn::KMaxPooling::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                         );
          }
          iVar26 = *(int *)((long)pvVar2 + uVar12 * 4);
          lVar16 = (long)iVar26;
          Tensor::operator*(&local_70,dEdxi);
          if ((lVar16 < 0) ||
             (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value < lVar16)) {
            poVar9 = operator<<((ostream *)&std::cerr,d);
            Tensor::operator*(&local_70,fx);
            poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                                               *)&local_70);
            poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
            Tensor::operator*(&local_50,dEdxi);
            poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                                               *)&local_50);
            std::endl<char,std::char_traits<char>>(poVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"MM:",3);
            uVar14 = 0;
            while( true ) {
              uVar15 = (ulong)(this->super_Node).dim.nd;
              auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              if (uVar15 == 0) {
                iVar27 = 1;
              }
              else {
                auVar21 = vpbroadcastq_avx512f();
                uVar12 = 0;
                auVar22 = vpbroadcastd_avx512f(ZEXT416(1));
                do {
                  auVar23 = vmovdqa64_avx512f(auVar22);
                  auVar22 = vpbroadcastq_avx512f();
                  auVar24 = vporq_avx512f(auVar22,auVar19);
                  auVar22 = vporq_avx512f(auVar22,auVar20);
                  uVar6 = vpcmpuq_avx512f(auVar22,auVar21,2);
                  bVar7 = (byte)uVar6;
                  uVar6 = vpcmpuq_avx512f(auVar24,auVar21,2);
                  bVar8 = (byte)uVar6;
                  uVar17 = CONCAT11(bVar8,bVar7);
                  auVar22 = vmovdqu32_avx512f(*(undefined1 (*) [64])(d->d + uVar12));
                  auVar25._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar22._4_4_;
                  auVar25._0_4_ = (uint)(bVar7 & 1) * auVar22._0_4_;
                  auVar25._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar22._8_4_;
                  auVar25._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar22._12_4_;
                  auVar25._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar22._16_4_;
                  auVar25._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar22._20_4_;
                  auVar25._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar22._24_4_;
                  auVar25._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar22._28_4_;
                  auVar25._32_4_ = (uint)(bVar8 & 1) * auVar22._32_4_;
                  auVar25._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar22._36_4_;
                  auVar25._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar22._40_4_;
                  auVar25._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar22._44_4_;
                  auVar25._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar22._48_4_;
                  auVar25._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar22._52_4_;
                  auVar25._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar22._56_4_;
                  auVar25._60_4_ = (uint)(bVar8 >> 7) * auVar22._60_4_;
                  auVar22 = vpmulld_avx512f(auVar25,auVar23);
                  uVar12 = uVar12 + 0x10;
                } while ((uVar15 + 0xf & 0x1fffffff0) != uVar12);
                auVar19 = vmovdqa32_avx512f(auVar22);
                auVar21._0_4_ =
                     (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar23._0_4_;
                bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
                auVar21._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar23._4_4_;
                bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
                auVar21._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar23._8_4_;
                bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
                auVar21._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar23._12_4_;
                bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
                auVar21._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar23._16_4_;
                bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
                auVar21._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar23._20_4_;
                bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
                auVar21._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar23._24_4_;
                bVar3 = (bool)((byte)(uVar17 >> 7) & 1);
                auVar21._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar23._28_4_;
                auVar21._32_4_ =
                     (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._32_4_;
                bVar3 = (bool)(bVar8 >> 1 & 1);
                auVar21._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar23._36_4_;
                bVar3 = (bool)(bVar8 >> 2 & 1);
                auVar21._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar23._40_4_;
                bVar3 = (bool)(bVar8 >> 3 & 1);
                auVar21._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar23._44_4_;
                bVar3 = (bool)(bVar8 >> 4 & 1);
                auVar21._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar23._48_4_;
                bVar3 = (bool)(bVar8 >> 5 & 1);
                auVar21._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar23._52_4_;
                bVar3 = (bool)(bVar8 >> 6 & 1);
                auVar21._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar23._56_4_;
                auVar21._60_4_ =
                     (uint)(bVar8 >> 7) * auVar19._60_4_ |
                     (uint)!(bool)(bVar8 >> 7) * auVar23._60_4_;
                auVar18 = vextracti64x4_avx512f(auVar21,1);
                auVar19 = vpmulld_avx512f(auVar21,ZEXT3264(auVar18));
                auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
                auVar5 = vpshufd_avx(auVar4,0xee);
                auVar4 = vpmulld_avx(auVar4,auVar5);
                auVar5 = vpshufd_avx(auVar4,0x55);
                auVar4 = vpmulld_avx(auVar4,auVar5);
                iVar27 = auVar4._0_4_;
              }
              if (iVar27 * (this->super_Node).dim.bd <= uVar14) break;
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data._0_1_ = 0x20;
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)&local_70,1);
              std::ostream::operator<<(poVar9,*(int *)((long)pvVar2 + uVar14 * 4));
              uVar14 = uVar14 + 1;
            }
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            poVar9 = std::operator<<((ostream *)&std::cerr,"BAD: ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar26);
            std::endl<char,std::char_traits<char>>(poVar9);
            abort();
          }
          Tensor::operator*(&local_70,dEdf);
          if ((local_70.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value <= (long)uVar15) ||
             (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= (long)uVar12)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 0]"
                         );
          }
          fVar1 = *(float *)(local_70.
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             .
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             .m_rows.m_value * uVar12 * 4 +
                             CONCAT71(local_70.
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                      .
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                      .m_data._1_7_,
                                      local_70.
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                      .
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                      .m_data._0_1_) + uVar15 * 4);
          Tensor::operator*(&local_50,dEdxi);
          if ((local_50.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value <= (long)uVar15) ||
             (local_50.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= lVar16)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                         );
          }
          uVar13 = (uint)uVar12 + 1;
          uVar12 = (ulong)uVar13;
          local_50.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data[local_50.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value * lVar16 + uVar15] =
               fVar1 + local_50.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data[local_50.
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               .
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                               .m_rows.m_value * lVar16 + uVar15];
          auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        } while (uVar13 != local_a4);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar14);
  }
  return;
}

Assistant:

void KMaxPooling::backward_impl(const vector<const Tensor*>& xs,
                           const Tensor& fx,
                           const Tensor& dEdf,
                           unsigned i,
                           Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("KMaxPooling::backward not implemented for CUDA");
#else
  const unsigned rows = dim.rows();
  const unsigned cols = dim.cols();
  const int* maxmap = static_cast<const int*>(aux_mem);
  for (unsigned i = 0; i < rows; ++i) {
    unsigned mi = 0;
    for (unsigned j = 0; j < cols; ++j) {
      assert(mi < dim.size());
      const int oj = maxmap[mi++];
      if (oj > (*dEdxi).cols() || oj < 0) {
        cerr << dim << (*fx) << endl << (*dEdxi) << endl;
        cerr << "MM:"; for (unsigned k=0;k < dim.size(); ++k) cerr << ' ' << maxmap[k];
        cerr << endl;
        cerr << "BAD: " << oj << endl; abort();
      }
      (*dEdxi)(i, oj) += (*dEdf)(i, j);
    }
  }
#endif
}